

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAppInterfaceStd.h
# Opt level: O2

void nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::error(Exception aError)

{
  char *pcVar1;
  undefined7 in_register_00000039;
  
  pcVar1 = (char *)__cxa_allocate_exception(0x20);
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure
            (pcVar1,(error_code *)
                    (csErrorMessages + (CONCAT71(in_register_00000039,aError) & 0xffffffff)));
  __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

static void error(Exception const aError) {
    throw std::ios_base::failure(csErrorMessages[static_cast<size_t>(aError)]);
  }